

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

string * __thiscall
Fossilize::extract_string_abi_cxx11_
          (string *__return_storage_ptr__,Fossilize *this,uint32_t *words,uint32_t num_words)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)words != 0) {
    uVar5 = 0;
    bVar4 = false;
    do {
      uVar6 = *(uint *)(this + uVar5 * 4);
      bVar7 = false;
      uVar3 = 0;
      do {
        if ((char)uVar6 == '\0') {
          bVar4 = true;
          break;
        }
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar6 = uVar6 >> 8;
        bVar7 = 2 < uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar3 != 4);
      if (!bVar7) {
        if (bVar4) {
          return __return_storage_ptr__;
        }
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          return __return_storage_ptr__;
        }
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != ((ulong)words & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string extract_string(const uint32_t *words, uint32_t num_words)
{
	std::string ret;
	for (uint32_t i = 0; i < num_words; i++)
	{
		uint32_t w = words[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			auto c = char(w & 0xff);
			if (c == '\0')
				return ret;
			ret += c;
		}
	}
	return ret;
}